

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O0

unique_ptr<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>_> __thiscall
Pl_DCT::make_compress_config(Pl_DCT *this,function<void_(jpeg_compress_struct_*)> *f)

{
  unique_ptr<(anonymous_namespace)::FunctionCallbackConfig,_std::default_delete<(anonymous_namespace)::FunctionCallbackConfig>_>
  local_20 [2];
  function<void_(jpeg_compress_struct_*)> *f_local;
  
  local_20[1]._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::FunctionCallbackConfig,_std::default_delete<(anonymous_namespace)::FunctionCallbackConfig>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::FunctionCallbackConfig_*,_std::default_delete<(anonymous_namespace)::FunctionCallbackConfig>_>
  .super__Head_base<0UL,_(anonymous_namespace)::FunctionCallbackConfig_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::FunctionCallbackConfig,_std::default_delete<(anonymous_namespace)::FunctionCallbackConfig>,_true,_true>
        )(__uniq_ptr_data<(anonymous_namespace)::FunctionCallbackConfig,_std::default_delete<(anonymous_namespace)::FunctionCallbackConfig>,_true,_true>
          )f;
  f_local = (function<void_(jpeg_compress_struct_*)> *)this;
  std::
  make_unique<(anonymous_namespace)::FunctionCallbackConfig,std::function<void(jpeg_compress_struct*)>&>
            ((function<void_(jpeg_compress_struct_*)> *)local_20);
  std::unique_ptr<Pl_DCT::CompressConfig,std::default_delete<Pl_DCT::CompressConfig>>::
  unique_ptr<(anonymous_namespace)::FunctionCallbackConfig,std::default_delete<(anonymous_namespace)::FunctionCallbackConfig>,void>
            ((unique_ptr<Pl_DCT::CompressConfig,std::default_delete<Pl_DCT::CompressConfig>> *)this,
             local_20);
  std::
  unique_ptr<(anonymous_namespace)::FunctionCallbackConfig,_std::default_delete<(anonymous_namespace)::FunctionCallbackConfig>_>
  ::~unique_ptr(local_20);
  return (__uniq_ptr_data<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>,_true,_true>
          )(__uniq_ptr_data<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Pl_DCT::CompressConfig>
Pl_DCT::make_compress_config(std::function<void(jpeg_compress_struct*)> f)
{
    return std::make_unique<FunctionCallbackConfig>(f);
}